

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O1

void sptk::PrintDataType(string *symbol,ostream *stream)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  string data_type;
  ostringstream oss;
  char *local_1e0;
  char *local_1d8;
  char local_1d0 [16];
  char *local_1c0;
  long local_1b8;
  char local_1b0 [16];
  long local_1a0 [2];
  undefined8 uStack_190;
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"");
  iVar2 = std::__cxx11::string::compare((char *)symbol);
  if (iVar2 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x10c4f1);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)symbol);
    if (iVar2 == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x10c501);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)symbol);
      if (iVar2 == 0) {
        bVar1 = true;
        std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x10c512);
        goto LAB_001060bb;
      }
      iVar2 = std::__cxx11::string::compare((char *)symbol);
      if (iVar2 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x10c512);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)symbol);
        if (iVar2 == 0) {
          std::__cxx11::string::_M_replace((ulong)&local_1e0,0,local_1d8,0x10c523);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)symbol);
          if (iVar2 == 0) {
            std::__cxx11::string::operator=((string *)&local_1e0,"unsigned char");
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)symbol);
            if (iVar2 == 0) {
              std::__cxx11::string::operator=((string *)&local_1e0,"unsigned short");
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)symbol);
              if (iVar2 == 0) {
                std::__cxx11::string::operator=((string *)&local_1e0,"unsigned int");
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)symbol);
                if (iVar2 == 0) {
                  pcVar4 = "unsigned int";
LAB_00106293:
                  std::__cxx11::string::operator=((string *)&local_1e0,pcVar4);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)symbol);
                  if (iVar2 == 0) {
                    pcVar4 = "unsigned long";
                  }
                  else {
                    iVar2 = std::__cxx11::string::compare((char *)symbol);
                    if (iVar2 == 0) {
                      pcVar4 = "float";
                      goto LAB_00106293;
                    }
                    iVar2 = std::__cxx11::string::compare((char *)symbol);
                    if (iVar2 != 0) {
                      iVar2 = std::__cxx11::string::compare((char *)symbol);
                      if (iVar2 != 0) {
                        iVar2 = std::__cxx11::string::compare((char *)symbol);
                        if (iVar2 == 0) {
                          std::__cxx11::string::operator=((string *)&local_1e0,"ascii");
                        }
                        bVar1 = false;
                        goto LAB_001060bb;
                      }
                      std::__cxx11::string::operator=((string *)&local_1e0,"long double");
                      goto LAB_001060b8;
                    }
                    pcVar4 = "double";
                  }
                  std::__cxx11::string::operator=((string *)&local_1e0,pcVar4);
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001060b8:
  bVar1 = true;
LAB_001060bb:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(undefined8 *)((long)&uStack_190 + *(long *)(local_1a0[0] + -0x18)) = 2;
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,(symbol->_M_dataplus)._M_p,symbol->_M_string_length);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1e0,(long)local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    lVar5 = 5;
    pcVar4 = "byte)";
  }
  else {
    lVar5 = 1;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_1e0,(long)local_1d8);
    pcVar4 = ")";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,lVar5);
  lVar5 = *(long *)stream;
  *(undefined8 *)(stream + *(long *)(lVar5 + -0x18) + 0x10) = 0x1b;
  lVar5 = *(long *)(lVar5 + -0x18);
  *(uint *)(stream + lVar5 + 0x18) = *(uint *)(stream + lVar5 + 0x18) & 0xffffff4f | 0x20;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_1c0,local_1b8);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  return;
}

Assistant:

void PrintDataType(const std::string& symbol, std::ostream* stream) {
  std::string data_type("");
  std::size_t data_size(0);

  if ("c" == symbol) {
    data_type = "char";
    data_size = sizeof(std::int8_t);
  } else if ("s" == symbol) {
    data_type = "short";
    data_size = sizeof(std::int16_t);
  } else if ("h" == symbol) {
    data_type = "int";
    data_size = sizeof(int24_t);
  } else if ("i" == symbol) {
    data_type = "int";
    data_size = sizeof(std::int32_t);
  } else if ("l" == symbol) {
    data_type = "long";
    data_size = sizeof(std::int64_t);
  } else if ("C" == symbol) {
    data_type = "unsigned char";
    data_size = sizeof(std::uint8_t);
  } else if ("S" == symbol) {
    data_type = "unsigned short";
    data_size = sizeof(std::uint16_t);
  } else if ("H" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(uint24_t);
  } else if ("I" == symbol) {
    data_type = "unsigned int";
    data_size = sizeof(std::uint32_t);
  } else if ("L" == symbol) {
    data_type = "unsigned long";
    data_size = sizeof(std::uint64_t);
  } else if ("f" == symbol) {
    data_type = "float";
    data_size = sizeof(float);
  } else if ("d" == symbol) {
    data_type = "double";
    data_size = sizeof(double);
  } else if ("e" == symbol) {
    data_type = "long double";
    data_size = sizeof(long double);
  } else if ("a" == symbol) {
    data_type = "ascii";
  }

  std::ostringstream oss;
  oss << std::setw(2) << std::left << symbol;
  if (0 < data_size) {
    oss << "(" << data_type << ", " << data_size << "byte)";
  } else {
    oss << "(" << data_type << ")";
  }
  *stream << std::setw(27) << std::left << oss.str();
}